

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Reg1Unsigned1(ByteCodeWriter *this,OpCode op,RegSlot R0,uint C1)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot R0_00;
  undefined4 *puVar5;
  FunctionBody *this_00;
  RegSlot local_3c;
  uint local_38;
  OpCode local_34;
  ProfileId local_32 [3];
  OpCode op_local;
  ProfileId profileId;
  
  local_34 = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0xa);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x958,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_00894d00;
    *puVar5 = 0;
  }
  if (R0 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar3) {
      *puVar5 = 0;
      Throw::InternalError();
    }
LAB_00894d00:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  this_00 = this->m_functionWrite;
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar3) goto LAB_00894d00;
    *puVar5 = 0;
    this_00 = this->m_functionWrite;
  }
  R0_00 = FunctionBody::MapRegSlot(this_00,R0);
  local_32[0] = 0xffff;
  bVar3 = DoProfileNewScArrayOp(this,op);
  if (bVar3) {
    bVar3 = DynamicProfileInfo::IsEnabled(NativeArrayPhase,this->m_functionWrite);
    if (!bVar3) goto LAB_00894bf1;
    TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
    if (TVar1 == 0xffff) goto LAB_00894bf1;
    this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
    local_32[0] = TVar1;
LAB_00894c0b:
    OpCodeUtil::ConvertNonCallOpToProfiled(&local_34);
    bVar3 = true;
    op = local_34;
  }
  else {
LAB_00894bf1:
    if (op == InitForInEnumerator) {
      bVar3 = FunctionBody::AllocProfiledForInLoopCount(this->m_functionWrite,local_32);
      if (bVar3) goto LAB_00894c0b;
      op = InitForInEnumerator;
    }
    bVar3 = false;
  }
  bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00,C1);
  if (!bVar4) {
    bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,local_34,R0_00,C1);
    if (!bVar4) {
      local_3c = R0_00;
      local_38 = C1;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_34,this);
      Data::Write(&this->m_byteCodeData,&local_3c,8);
    }
  }
  if (bVar3) {
    Data::Write(&this->m_byteCodeData,local_32,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg1Unsigned1(OpCode op, RegSlot R0, uint C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg1Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);

        ProfileId profileId = Constants::NoProfileId;
        bool isProfiled = (DoProfileNewScArrayOp(op) &&
            DoDynamicProfileOpcode(NativeArrayPhase, true) &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId))
            || (op == OpCode::InitForInEnumerator &&
                this->m_functionWrite->AllocProfiledForInLoopCount(&profileId));

        if (isProfiled)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        MULTISIZE_LAYOUT_WRITE(Reg1Unsigned1, op, R0, C1);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }